

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_roi_utils.c
# Opt level: O0

MPP_RET gen_vepu54x_roi(MppEncRoiImpl *ctx,Vepu541RoiCfg *dst)

{
  RK_S32 RVar1;
  RK_S32 RVar2;
  RK_S32 RVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  int local_78;
  RK_U32 stride_cu64_h;
  RK_S32 y;
  RK_S32 x;
  RK_S32 pos_y_end;
  RK_S32 pos_x_end;
  RK_S32 pos_y_init;
  RK_S32 pos_x_init;
  RK_S32 roi_height;
  RK_S32 roi_width;
  RK_U8 *map;
  Vepu541RoiCfg *p;
  MPP_RET local_40;
  RK_S32 i;
  MPP_RET ret;
  Vepu541RoiCfg cfg;
  RK_S32 stride_v;
  RK_S32 stride_h;
  RK_S32 mb_h;
  RK_S32 mb_w;
  RoiRegionCfg *region;
  Vepu541RoiCfg *dst_local;
  MppEncRoiImpl *ctx_local;
  
  _mb_h = ctx->regions;
  iVar4 = (int)((long)((long)(ctx->w + 0xf) & 0xfffffffffffffff0U) / 0x10);
  iVar5 = (int)((long)((long)(ctx->h + 0xf) & 0xfffffffffffffff0U) / 0x10);
  uVar6 = iVar4 + 3U & 0xfffffffc;
  local_40 = MPP_NOK;
  memset(ctx->cu_map,0,(ulong)ctx->cu_size);
  for (p._4_4_ = 0; p._4_4_ < (int)(uVar6 * (iVar5 + 3U & 0xfffffffc)); p._4_4_ = p._4_4_ + 1) {
    dst[p._4_4_] = (Vepu541RoiCfg)0x80;
  }
  if ((ctx->w < 1) || (ctx->h < 1)) {
    _mpp_log_l(2,"enc_roi_utils","invalid size [%d:%d]\n","gen_vepu54x_roi",ctx->w,ctx->h);
  }
  else {
    local_40 = MPP_OK;
    for (p._4_4_ = 0; p._4_4_ < ctx->count; p._4_4_ = p._4_4_ + 1) {
      if ((ctx->w < (int)((uint)_mb_h->x + (uint)_mb_h->w)) ||
         (ctx->h < (int)((uint)_mb_h->y + (uint)_mb_h->h))) {
        local_40 = MPP_NOK;
      }
      if ((1 < _mb_h->force_intra) || (1 < _mb_h->qp_mode)) {
        local_40 = MPP_NOK;
      }
      if (((_mb_h->qp_mode != 0) && (0x33 < _mb_h->qp_val)) ||
         ((_mb_h->qp_mode == 0 && ((0x33 < _mb_h->qp_val || (_mb_h->qp_val < -0x33)))))) {
        local_40 = MPP_NOK;
      }
      if (local_40 != MPP_OK) {
        _mpp_log_l(2,"enc_roi_utils","region %d invalid param:\n","gen_vepu54x_roi",p._4_4_);
        _mpp_log_l(2,"enc_roi_utils","position [%d:%d:%d:%d] vs [%d:%d]\n","gen_vepu54x_roi",
                   _mb_h->x,_mb_h->y,_mb_h->w,_mb_h->h,ctx->w,ctx->h);
        _mpp_log_l(2,"enc_roi_utils","force intra %d qp mode %d val %d\n","gen_vepu54x_roi",
                   _mb_h->force_intra,_mb_h->qp_mode,_mb_h->qp_val);
        return local_40;
      }
      _mb_h = _mb_h + 1;
    }
    _mb_h = ctx->regions;
    for (p._4_4_ = 0; p._4_4_ < ctx->count; p._4_4_ = p._4_4_ + 1) {
      _roi_height = ctx->cu_map;
      uVar7 = (_mb_h->w + 0xf) / 0x10;
      uVar8 = (_mb_h->h + 0xf) / 0x10;
      uVar9 = (_mb_h->x + 0xf) / 0x10;
      uVar10 = (_mb_h->y + 0xf) / 0x10;
      if ((iVar4 <= (int)uVar9) &&
         (_mpp_log_l(2,"enc_roi_utils","Assertion %s failed at %s:%d\n",0,
                     "pos_x_init >= 0 && pos_x_init < mb_w","gen_vepu54x_roi",0x120),
         (_mpp_debug & 0x10000000) != 0)) {
        abort();
      }
      if ((iVar4 < (int)(uVar9 + uVar7)) &&
         (_mpp_log_l(2,"enc_roi_utils","Assertion %s failed at %s:%d\n",0,
                     "pos_x_end >= 0 && pos_x_end <= mb_w","gen_vepu54x_roi",0x121),
         (_mpp_debug & 0x10000000) != 0)) {
        abort();
      }
      if ((iVar5 <= (int)uVar10) &&
         (_mpp_log_l(2,"enc_roi_utils","Assertion %s failed at %s:%d\n",0,
                     "pos_y_init >= 0 && pos_y_init < mb_h","gen_vepu54x_roi",0x122),
         (_mpp_debug & 0x10000000) != 0)) {
        abort();
      }
      if ((iVar5 < (int)(uVar10 + uVar8)) &&
         (_mpp_log_l(2,"enc_roi_utils","Assertion %s failed at %s:%d\n",0,
                     "pos_y_end >= 0 && pos_y_end <= mb_h","gen_vepu54x_roi",0x123),
         (_mpp_debug & 0x10000000) != 0)) {
        abort();
      }
      RVar1 = _mb_h->force_intra;
      RVar2 = _mb_h->qp_val;
      RVar3 = _mb_h->qp_mode;
      map = (RK_U8 *)(dst + (int)(uVar10 * uVar6 + uVar9));
      _roi_height = _roi_height + (int)(uVar10 * uVar6 + uVar9);
      for (local_78 = 0; local_78 < (int)uVar8; local_78 = local_78 + 1) {
        for (stride_cu64_h = 0; (int)stride_cu64_h < (int)uVar7; stride_cu64_h = stride_cu64_h + 1)
        {
          *(ushort *)(map + (long)(int)stride_cu64_h * 2) =
               (ushort)RVar1 & 1 | 0x80 | ((ushort)RVar2 & 0x7f) << 8 | (short)RVar3 << 0xf;
          if (ctx->type == MPP_VIDEO_CodingAVC) {
            _roi_height[(int)stride_cu64_h] = '\x01';
          }
        }
        map = map + (long)(int)uVar6 * 2;
        _roi_height = _roi_height + (int)uVar6;
      }
      if (ctx->type == MPP_VIDEO_CodingHEVC) {
        uVar7 = (int)(uVar6 << 4) / 0x40;
        pos_x_init = (_mb_h->w + 0x40) / 0x40;
        pos_y_init = (_mb_h->h + 0x40) / 0x40;
        if (_mb_h->x < 0x40) {
          pos_x_end = 0;
          pos_x_init = pos_x_init + 2;
        }
        else if ((uint)_mb_h->x % 0x40 == 0) {
          pos_x_end = _mb_h->x / 0x40;
        }
        else {
          pos_x_end = (int)(_mb_h->x - 0x40) / 0x40;
          pos_x_init = pos_x_init + 2;
        }
        if (_mb_h->y < 0x40) {
          pos_y_end = 0;
          pos_y_init = pos_y_init + 2;
        }
        else if ((uint)_mb_h->y % 0x40 == 0) {
          pos_y_end = _mb_h->y / 0x40;
        }
        else {
          pos_y_end = (int)(_mb_h->y - 0x40) / 0x40;
          pos_y_init = pos_y_init + 2;
        }
        _roi_height = ctx->cu_map + (pos_y_end * uVar7 + pos_x_end);
        for (local_78 = 0; local_78 < pos_y_init; local_78 = local_78 + 1) {
          for (stride_cu64_h = 0; (int)stride_cu64_h < pos_x_init; stride_cu64_h = stride_cu64_h + 1
              ) {
            _roi_height[(int)stride_cu64_h] = '\x01';
          }
          _roi_height = _roi_height + uVar7;
        }
      }
      _mb_h = _mb_h + 1;
    }
  }
  return local_40;
}

Assistant:

static MPP_RET gen_vepu54x_roi(MppEncRoiImpl *ctx, Vepu541RoiCfg *dst)
{
    RoiRegionCfg *region = ctx->regions;
    RK_S32 mb_w = MPP_ALIGN(ctx->w, 16) / 16;
    RK_S32 mb_h = MPP_ALIGN(ctx->h, 16) / 16;
    RK_S32 stride_h = MPP_ALIGN(mb_w, 4);
    RK_S32 stride_v = MPP_ALIGN(mb_h, 4);
    Vepu541RoiCfg cfg;
    MPP_RET ret = MPP_NOK;
    RK_S32 i;

    memset(ctx->cu_map, 0, ctx->cu_size);

    cfg.force_intra = 0;
    cfg.reserved    = 0;
    cfg.qp_area_idx = 0;
    cfg.qp_area_en  = 1;
    cfg.qp_adj      = 0;
    cfg.qp_adj_mode = 0;

    /* step 1. reset all the config */
    for (i = 0; i < stride_h * stride_v; i++)
        memcpy(dst + i, &cfg, sizeof(cfg));

    if (ctx->w <= 0 || ctx->h <= 0) {
        mpp_err_f("invalid size [%d:%d]\n", ctx->w, ctx->h);
        goto DONE;
    }

    /* check region config */
    ret = MPP_OK;
    for (i = 0; i < ctx->count; i++, region++) {
        if (region->x + region->w > ctx->w || region->y + region->h > ctx->h)
            ret = MPP_NOK;

        if (region->force_intra > 1 || region->qp_mode > 1)
            ret = MPP_NOK;

        if ((region->qp_mode && region->qp_val > 51) ||
            (!region->qp_mode && (region->qp_val > 51 || region->qp_val < -51)))
            ret = MPP_NOK;

        if (ret) {
            mpp_err_f("region %d invalid param:\n", i);
            mpp_err_f("position [%d:%d:%d:%d] vs [%d:%d]\n",
                      region->x, region->y, region->w, region->h, ctx->w, ctx->h);
            mpp_err_f("force intra %d qp mode %d val %d\n",
                      region->force_intra, region->qp_mode, region->qp_val);
            goto DONE;
        }
    }

    region = ctx->regions;
    /* step 2. setup region for top to bottom */
    for (i = 0; i < ctx->count; i++, region++) {
        Vepu541RoiCfg *p = dst;
        RK_U8 *map = ctx->cu_map;
        RK_S32 roi_width  = (region->w + 15) / 16;
        RK_S32 roi_height = (region->h + 15) / 16;
        RK_S32 pos_x_init = (region->x + 15) / 16;
        RK_S32 pos_y_init = (region->y + 15) / 16;
        RK_S32 pos_x_end  = pos_x_init + roi_width;
        RK_S32 pos_y_end  = pos_y_init + roi_height;
        RK_S32 x, y;

        mpp_assert(pos_x_init >= 0 && pos_x_init < mb_w);
        mpp_assert(pos_x_end  >= 0 && pos_x_end <= mb_w);
        mpp_assert(pos_y_init >= 0 && pos_y_init < mb_h);
        mpp_assert(pos_y_end  >= 0 && pos_y_end <= mb_h);

        cfg.force_intra = region->force_intra;
        cfg.reserved    = 0;
        cfg.qp_area_idx = 0;
        // NOTE: When roi is enabled the qp_area_en should be one.
        cfg.qp_area_en  = 1; // region->area_map_en;
        cfg.qp_adj      = region->qp_val;
        cfg.qp_adj_mode = region->qp_mode;

        p += pos_y_init * stride_h + pos_x_init;
        map += pos_y_init * stride_h + pos_x_init;
        for (y = 0; y < roi_height; y++) {
            for (x = 0; x < roi_width; x++) {
                memcpy(p + x, &cfg, sizeof(cfg));
                if (ctx->type == MPP_VIDEO_CodingAVC) {
                    *(map + x) = 1;
                }

            }
            p += stride_h;
            map += stride_h;
        }

        if (ctx->type == MPP_VIDEO_CodingHEVC) {
            map = ctx->cu_map;
            RK_U32 stride_cu64_h = stride_h * 16 / 64;

            roi_width  = (region->w + 64) / 64;
            roi_height = (region->h + 64) / 64;

            if (region->x < 64) {
                pos_x_init = 0;
                roi_width += 2;
            } else if (region->x % 64) {
                pos_x_init = (region->x - 64) / 64;
                roi_width += 2;
            } else
                pos_x_init = region->x / 64;

            if (region->y < 64) {
                pos_y_init = 0;
                roi_height += 2;
            } else if (region->y % 64) {
                pos_y_init = (region->y - 64) / 64;
                roi_height += 2;
            } else
                pos_y_init = region->y / 64;

            map += pos_y_init * stride_cu64_h + pos_x_init;
            for (y = 0; y < roi_height; y++) {
                for (x = 0; x < roi_width; x++) {
                    *(map + x) = 1;
                }
                map += stride_cu64_h;
            }
        }
    }

DONE:
    return ret;
}